

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

void findMeans(double *x,int N,int stride,double *means)

{
  int iVar1;
  double dVar2;
  int local_28;
  int batches;
  int j;
  int i;
  double *means_local;
  int stride_local;
  int N_local;
  double *x_local;
  
  dVar2 = ceil((double)N / (double)stride);
  iVar1 = (int)dVar2;
  for (batches = 0; batches < stride; batches = batches + 1) {
    means[batches] = 0.0;
  }
  for (batches = 0; batches < iVar1 + -1; batches = batches + 1) {
    for (local_28 = 0; local_28 < stride; local_28 = local_28 + 1) {
      means[local_28] = x[batches * stride + local_28] + means[local_28];
    }
  }
  for (local_28 = 0; local_28 < N - (iVar1 + -1) * stride; local_28 = local_28 + 1) {
    means[local_28] = x[(iVar1 + -1) * stride + local_28] + means[local_28];
    means[local_28] = means[local_28] / (double)iVar1;
  }
  for (local_28 = N - (iVar1 + -1) * stride; local_28 < stride; local_28 = local_28 + 1) {
    means[local_28] = means[local_28] / (double)(iVar1 + -1);
  }
  return;
}

Assistant:

static void findMeans(double *x, int N, int stride, double *means) {
    int i, j, batches;

    batches = ceil((double) N / (double) stride);

    for(i = 0; i < stride;++i) {
        means[i] = 0.0;
    }

    for(i = 0; i < batches-1;++i) {
        for(j = 0; j < stride;++j) {
            means[j] += x[i*stride+j];
        }
    }

    for(j = 0; j < N - (batches-1)*stride;++j) {
        means[j] += x[(batches-1)*stride + j];
        means[j] /= (double) batches;
    }

    for(j = N - (batches-1)*stride; j < stride;++j) {
        means[j] /= (double) (batches - 1);
    }

}